

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

int it_xm_read_pattern(IT_PATTERN *pattern,DUMBFILE *f,int n_channels,uchar *buffer,int version)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  ulong uVar6;
  IT_ENTRY *entry;
  uchar uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  uint effect;
  size_t __size;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  int local_38;
  
  uVar2 = dumbfile_igetl(f);
  iVar15 = -1;
  if ((uVar2 == (version == 0x102 ^ 9)) && (iVar3 = dumbfile_getc(f), iVar3 == 0)) {
    if (version == 0x102) {
      iVar3 = dumbfile_getc(f);
      iVar3 = iVar3 + 1;
    }
    else {
      iVar3 = dumbfile_igetw(f);
    }
    pattern->n_rows = iVar3;
    iVar3 = dumbfile_igetw(f);
    pattern->n_entries = 0;
    iVar4 = dumbfile_error(f);
    if (iVar4 == 0) {
      if (iVar3 == 0) {
LAB_00639427:
        iVar15 = 0;
      }
      else if ((iVar3 == n_channels * 0x500 ||
                SBORROW4(iVar3,n_channels * 0x500) != iVar3 + n_channels * -0x500 < 0) &&
              (iVar5 = dumbfile_getnc((char *)buffer,iVar3,f), iVar3 <= iVar5)) {
        pattern->n_entries = 0;
        iVar4 = 0;
        iVar13 = 0;
        iVar11 = 0;
        for (iVar12 = 0; iVar12 < iVar3; iVar12 = iVar12 + iVar14) {
          iVar13 = iVar13 + 1;
          bVar16 = n_channels <= iVar13;
          if (n_channels <= iVar13) {
            iVar13 = 0;
          }
          iVar4 = iVar4 + (uint)bVar16 + 1;
          pattern->n_entries = iVar4;
          iVar14 = 5;
          if ((char)buffer[iVar12] < '\0') {
            iVar14 = ""[buffer[iVar12] & 0x1f] + 1;
          }
          iVar11 = iVar11 + (uint)bVar16;
        }
        iVar12 = pattern->n_rows - iVar11;
        if (iVar11 <= pattern->n_rows) {
          uVar6 = (ulong)iVar4;
          __size = uVar6 * 7;
          while( true ) {
            uVar2 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar2;
            bVar16 = iVar12 == 0;
            iVar12 = iVar12 + -1;
            if (bVar16) break;
            pattern->n_entries = uVar2;
            __size = __size + 7;
          }
          entry = (IT_ENTRY *)malloc(__size);
          pattern->entry = entry;
          if (entry != (IT_ENTRY *)0x0) {
            iVar15 = 0;
            local_38 = 0;
            do {
              iVar4 = 0;
              do {
                if (iVar3 <= iVar15) {
                  iVar15 = pattern->n_rows;
                  for (; local_38 < iVar15; local_38 = local_38 + 1) {
                    entry->channel = 0xff;
                    entry = entry + 1;
                  }
                  goto LAB_00639427;
                }
                bVar8 = buffer[iVar15];
                bVar9 = bVar8 & 0x1f;
                iVar15 = (uint)(bVar8 >> 7) + iVar15;
                if (-1 < (char)bVar8) {
                  bVar9 = 0x1f;
                }
                if (bVar9 != 0) {
                  entry->channel = (uchar)iVar4;
                  entry->mask = '\0';
                  if ((bVar9 & 1) == 0) {
                    bVar8 = 0;
                  }
                  else {
                    lVar10 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    uVar7 = buffer[lVar10] + 0xff;
                    if (buffer[lVar10] == 'a') {
                      uVar7 = 0xff;
                    }
                    entry->note = uVar7;
                    entry->mask = '\x01';
                    bVar8 = 1;
                  }
                  if ((bVar9 & 2) != 0) {
                    lVar10 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    entry->instrument = buffer[lVar10];
                    bVar8 = bVar8 | 2;
                    entry->mask = bVar8;
                  }
                  if ((bVar9 & 4) != 0) {
                    lVar10 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    bVar1 = buffer[lVar10];
                    entry->mask = bVar8 + 4;
                    entry->volpan = bVar1;
                    if (((0xffdeU >> (bVar1 >> 4) & 1) == 0) &&
                       ((bVar1 >> 4 == 0 || (bVar1 != 0x50)))) {
                      entry->mask = bVar8;
                    }
                  }
                  uVar2 = 0;
                  if ((bVar9 & 8) == 0) {
                    effect = 0;
                  }
                  else {
                    lVar10 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    effect = (uint)buffer[lVar10];
                  }
                  if (0xf < bVar9) {
                    lVar10 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    uVar2 = (uint)buffer[lVar10];
                  }
                  _dumb_it_xm_convert_effect(effect,uVar2,entry,0);
                  entry = entry + 1;
                }
                iVar4 = iVar4 + 1;
              } while (iVar4 < n_channels);
              local_38 = local_38 + 1;
              entry->channel = 0xff;
              entry = entry + 1;
            } while( true );
          }
        }
      }
    }
  }
  return iVar15;
}

Assistant:

static int it_xm_read_pattern(IT_PATTERN *pattern, DUMBFILE *f, int n_channels, unsigned char *buffer, int version)
{
	int size;
	int pos;
	int channel;
	int row;
	int effect, effectvalue;
	IT_ENTRY *entry;

	/* pattern header size */
	if (dumbfile_igetl(f) != ( version == 0x0102 ? 0x08 : 0x09 ) ) {
		TRACE("XM error: unexpected pattern header size\n");
		return -1;
	}

	/* pattern data packing type */
	if (dumbfile_getc(f) != 0) {
		TRACE("XM error: unexpected pattern packing type\n");
		return -1;
	}

	if ( version == 0x0102 )
		pattern->n_rows = dumbfile_getc(f) + 1;
	else
		pattern->n_rows = dumbfile_igetw(f);  /* 1..256 */
	size = dumbfile_igetw(f);
	pattern->n_entries = 0;

	if (dumbfile_error(f))
		return -1;

	if (size == 0)
		return 0;

	if (size > 1280 * n_channels) {
		TRACE("XM error: pattern data size > %d bytes\n", 1280 * n_channels);
		return -1;
	}

    if (dumbfile_getnc((char *)buffer, size, f) < size)
		return -1;

	/* compute number of entries */
	pattern->n_entries = 0;
	pos = channel = row = 0;
	while (pos < size) {
		if (!(buffer[pos] & XM_ENTRY_PACKED) || (buffer[pos] & 31))
			pattern->n_entries++;

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			pattern->n_entries++;
		}

		if (buffer[pos] & XM_ENTRY_PACKED) {
			static const char offset[] = { 0, 1, 1, 2, 1, 2, 2, 3,   1, 2, 2, 3, 2, 3, 3, 4,
			                               1, 2, 2, 3, 2, 3, 3, 4,   2, 3, 3, 4, 3, 4, 4, 5 };
			pos += 1 + offset[buffer[pos] & 31];
		} else {
			pos += 5;
		}
	}

	if (row > pattern->n_rows) {
		TRACE("XM error: wrong number of rows in pattern data\n");
		return -1;
	}

	/* Whoops, looks like some modules may be short, a few channels, maybe even rows... */

	while (row < pattern->n_rows)
	{
		pattern->n_entries++;
		row++;
	}

	pattern->entry = malloc(pattern->n_entries * sizeof(*pattern->entry));
	if (!pattern->entry)
		return -1;

	/* read the entries */
	entry = pattern->entry;
	pos = channel = row = 0;
	while (pos < size) {
		unsigned char mask;

		if (buffer[pos] & XM_ENTRY_PACKED)
			mask = buffer[pos++] & 31;
		else
			mask = 31;

		if (mask) {
			ASSERT(entry < pattern->entry + pattern->n_entries);

			entry->channel = channel;
			entry->mask = 0;

			if (mask & XM_ENTRY_NOTE) {
				int note = buffer[pos++]; /* 1-96 <=> C0-B7 */
				entry->note = (note == XM_NOTE_OFF) ? (IT_NOTE_OFF) : (note-1);
				entry->mask |= IT_ENTRY_NOTE;
			}

			if (mask & XM_ENTRY_INSTRUMENT) {
				entry->instrument = buffer[pos++]; /* 1-128 */
				entry->mask |= IT_ENTRY_INSTRUMENT;
			}

			if (mask & XM_ENTRY_VOLUME)
				it_xm_convert_volume(buffer[pos++], entry);

			effect = effectvalue = 0;
			if (mask & XM_ENTRY_EFFECT)      effect = buffer[pos++];
			if (mask & XM_ENTRY_EFFECTVALUE) effectvalue = buffer[pos++];
			_dumb_it_xm_convert_effect(effect, effectvalue, entry, 0);

			entry++;
		}

		channel++;
		if (channel >= n_channels) {
			channel = 0;
			row++;
			IT_SET_END_ROW(entry);
			entry++;
		}
	}

	while (row < pattern->n_rows)
	{
		row++;
		IT_SET_END_ROW(entry);
		entry++;
	}

	return 0;
}